

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int fits_copy_cell2image(fitsfile *fptr,fitsfile *newptr,char *colname,long rownum,int *status)

{
  int iVar1;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int *in_R8;
  int npat;
  char *patterns [70] [2];
  char templt [81];
  char card [81];
  char tform [20];
  double zero;
  double scale;
  long incre;
  long twidth;
  LONGLONG tnull;
  LONGLONG rowlen;
  LONGLONG elemnum;
  LONGLONG startpos;
  LONGLONG repeat;
  LONGLONG ntodo;
  LONGLONG firstbyte;
  LONGLONG nbytes;
  LONGLONG naxes [9];
  int tstatus;
  int maxelem;
  int naxis;
  int bitpix;
  int typecode;
  int colnum;
  int hdutype;
  uchar buffer [30000];
  undefined1 *puVar3;
  int *status_00;
  char *pcVar4;
  int *status_01;
  int *piVar5;
  FITSfile *fptr_00;
  fitsfile *fptr_01;
  LONGLONG *status_02;
  fitsfile *fptr_02;
  char *keyroot;
  int *in_stack_ffffffffffff83d0;
  FITSfile **status_03;
  int *in_stack_ffffffffffff83d8;
  undefined1 *buffer_00;
  char *in_stack_ffffffffffff83e0;
  FITSfile **nbytes_00;
  undefined8 in_stack_ffffffffffff83e8;
  fitsfile *fptr_03;
  fitsfile *in_stack_ffffffffffff83f0;
  int *status_04;
  int *values;
  LONGLONG in_stack_ffffffffffff8400;
  LONGLONG in_stack_ffffffffffff8408;
  FITSfile *firstchar;
  undefined7 in_stack_ffffffffffff8410;
  undefined1 in_stack_ffffffffffff8417;
  undefined1 uVar6;
  int *in_stack_ffffffffffff8418;
  FITSfile *pFVar7;
  char *colname_00;
  char *templt_00;
  int casesen;
  fitsfile *fptr_04;
  LONGLONG *naxes_00;
  int in_stack_ffffffffffff8450;
  int in_stack_ffffffffffff8454;
  fitsfile *in_stack_ffffffffffff8458;
  LONGLONG in_stack_ffffffffffff8460;
  LONGLONG in_stack_ffffffffffff8468;
  int in_stack_ffffffffffff8474;
  fitsfile *in_stack_ffffffffffff8478;
  double *in_stack_ffffffffffff8490;
  fitsfile *in_stack_ffffffffffff8498;
  char *in_stack_ffffffffffff84a0;
  int in_stack_ffffffffffff84a8;
  int in_stack_ffffffffffff84ac;
  char *(*in_stack_ffffffffffff84b0) [2];
  undefined4 in_stack_ffffffffffff84b8;
  int in_stack_ffffffffffff84bc;
  fitsfile *in_stack_ffffffffffff84c0;
  fitsfile *in_stack_ffffffffffff84c8;
  long *in_stack_ffffffffffff84d0;
  LONGLONG *in_stack_ffffffffffff84d8;
  LONGLONG *in_stack_ffffffffffff84e0;
  int *in_stack_ffffffffffff84e8;
  LONGLONG *in_stack_ffffffffffff84f0;
  char *in_stack_ffffffffffff84f8;
  int in_stack_ffffffffffff8500;
  undefined4 in_stack_ffffffffffff8504;
  int in_stack_ffffffffffff8508;
  int *in_stack_ffffffffffff8510;
  undefined1 local_7748 [96];
  char local_76e8 [96];
  char local_7688 [32];
  char local_7668 [8];
  undefined1 local_7660 [8];
  char local_7658 [8];
  undefined1 local_7650 [16];
  undefined1 local_7640 [8];
  undefined1 local_7638 [8];
  fitsfile local_7630;
  FITSfile *local_7620;
  long local_7618;
  FITSfile *local_7610;
  FITSfile *local_7608;
  undefined8 local_75b0;
  undefined4 local_75a8;
  fitsfile local_75a4 [1876];
  int *local_60;
  undefined8 local_58;
  undefined8 local_50;
  int local_34;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffff83e8 >> 0x20);
  local_60 = in_R8;
  local_58 = in_RCX;
  local_50 = in_RDX;
  memset(local_7748,0,0x51);
  memcpy(&stack0xffffffffffff8458,&PTR_anon_var_dwarf_c1b7_00324520,0x460);
  if (*local_60 < 1) {
    iVar1 = ffgcno(in_stack_ffffffffffff83f0,iVar1,in_stack_ffffffffffff83e0,
                   in_stack_ffffffffffff83d8,in_stack_ffffffffffff83d0);
    if (iVar1 < 1) {
      templt_00 = local_7688;
      status_04 = (int *)((long)&local_75a4[0].Fptr + 4);
      puVar3 = local_7660;
      pcVar4 = local_7668;
      fptr_00 = (FITSfile *)local_7650;
      fptr_01 = local_75a4;
      status_02 = &local_75b0;
      fptr_02 = &local_7630;
      iVar1 = (int)((ulong)local_7638 >> 0x20);
      keyroot = local_7658;
      status_03 = &local_7630.Fptr;
      buffer_00 = local_7640;
      nbytes_00 = &local_75a4[0].Fptr;
      fptr_03 = (fitsfile *)(local_7650 + 8);
      values = local_60;
      colname_00 = pcVar4;
      pFVar7 = fptr_00;
      fptr_04 = fptr_01;
      naxes_00 = status_02;
      piVar5 = local_60;
      iVar2 = ffgcprll(in_stack_ffffffffffff8478,in_stack_ffffffffffff8474,in_stack_ffffffffffff8468
                       ,in_stack_ffffffffffff8460,(LONGLONG)in_stack_ffffffffffff8458,
                       in_stack_ffffffffffff8454,in_stack_ffffffffffff8490,
                       (double *)in_stack_ffffffffffff8498,in_stack_ffffffffffff84a0,
                       (long *)CONCAT44(in_stack_ffffffffffff84ac,in_stack_ffffffffffff84a8),
                       (int *)in_stack_ffffffffffff84b0,
                       (int *)CONCAT44(in_stack_ffffffffffff84bc,in_stack_ffffffffffff84b8),
                       (LONGLONG *)in_stack_ffffffffffff84c0,(LONGLONG *)in_stack_ffffffffffff84c8,
                       in_stack_ffffffffffff84d0,in_stack_ffffffffffff84d8,in_stack_ffffffffffff84e0
                       ,in_stack_ffffffffffff84e8,in_stack_ffffffffffff84f0,
                       in_stack_ffffffffffff84f8,
                       (int *)CONCAT44(in_stack_ffffffffffff8504,in_stack_ffffffffffff8500));
      casesen = (int)((ulong)pFVar7 >> 0x20);
      if (iVar2 < 1) {
        ffkeyn(keyroot,iVar1,(char *)fptr_02,(int *)status_02);
        ffgcnn(fptr_04,casesen,templt_00,colname_00,in_stack_ffffffffffff8418,
               (int *)CONCAT17(in_stack_ffffffffffff8417,in_stack_ffffffffffff8410));
        if ((int)local_75a4[0].Fptr == 2) {
          if (local_75a4[0].HDUposition < 0) {
            local_75a4[0].HDUposition = -local_75a4[0].HDUposition;
            local_75b0._4_4_ = 1;
            local_7608 = local_7630.Fptr;
          }
          else {
            ffgtdmll(in_stack_ffffffffffff8458,in_stack_ffffffffffff8454,in_stack_ffffffffffff8450,
                     piVar5,naxes_00,&fptr_04->HDUposition);
          }
          if (*local_60 < 1) {
            if (local_75a4[0].HDUposition == 0xb) {
              local_75a8 = 8;
              local_7610 = local_7630.Fptr;
            }
            else if (local_75a4[0].HDUposition == 0x15) {
              local_75a8 = 0x10;
              local_7610 = (FITSfile *)((long)local_7630.Fptr << 1);
            }
            else if (local_75a4[0].HDUposition == 0x29) {
              local_75a8 = 0x20;
              local_7610 = (FITSfile *)((long)local_7630.Fptr << 2);
            }
            else if (local_75a4[0].HDUposition == 0x2a) {
              local_75a8 = 0xffffffe0;
              local_7610 = (FITSfile *)((long)local_7630.Fptr << 2);
            }
            else if (local_75a4[0].HDUposition == 0x52) {
              local_75a8 = 0xffffffc0;
              local_7610 = (FITSfile *)((long)local_7630.Fptr << 3);
            }
            else if (local_75a4[0].HDUposition == 0x51) {
              local_75a8 = 0x40;
              local_7610 = (FITSfile *)((long)local_7630.Fptr << 3);
            }
            else {
              if (local_75a4[0].HDUposition != 0xe) {
                ffpmsg((char *)0x12e790);
                ffpmsg((char *)0x12e79d);
                ffpmsg((char *)0x12e7aa);
                ffpmsg((char *)0x12e7b6);
                *local_60 = 0x105;
                return 0x105;
              }
              local_75a8 = 8;
              local_7610 = local_7630.Fptr;
            }
            iVar1 = ffcrimll(fptr_02,(int)((ulong)status_02 >> 0x20),(int)status_02,
                             (LONGLONG *)fptr_01,&fptr_00->filehandle);
            if (iVar1 < 1) {
              status_00 = (int *)((ulong)puVar3 & 0xffffffff00000000);
              status_01 = (int *)((ulong)pcVar4 & 0xffffffff00000000);
              piVar5 = local_60;
              fits_translate_keywords
                        (in_stack_ffffffffffff84c8,in_stack_ffffffffffff84c0,
                         in_stack_ffffffffffff84bc,in_stack_ffffffffffff84b0,
                         in_stack_ffffffffffff84ac,in_stack_ffffffffffff84a8,
                         in_stack_ffffffffffff8500,in_stack_ffffffffffff8508,
                         in_stack_ffffffffffff8510);
              snprintf(local_76e8,0x51,
                       "HISTORY  This image was copied from row %ld of column \'%s\',",local_58,
                       local_50);
              ffflsh((fitsfile *)fptr_00,(int)((ulong)piVar5 >> 0x20),status_01);
              ffmbyt(fptr_01,(LONGLONG)fptr_00,(int)((ulong)piVar5 >> 0x20),status_01);
              local_7618 = 1;
              pFVar7 = local_7610;
              if (30000 < (long)local_7610) {
                pFVar7 = (FITSfile *)0x7530;
              }
              local_7620 = pFVar7;
              ffgbyt(fptr_03,(LONGLONG)nbytes_00,buffer_00,(int *)status_03);
              ffptbb((fitsfile *)pFVar7,
                     CONCAT17(in_stack_ffffffffffff8417,in_stack_ffffffffffff8410),
                     in_stack_ffffffffffff8408,in_stack_ffffffffffff8400,(uchar *)values,status_04);
              local_7610 = (FITSfile *)((long)local_7610 - (long)local_7620);
              local_7618 = (long)&local_7620->filehandle + local_7618;
              while( true ) {
                uVar6 = false;
                if (local_7610 != (FITSfile *)0x0) {
                  uVar6 = *local_60 < 1;
                }
                if ((bool)uVar6 == false) break;
                firstchar = local_7610;
                if (30000 < (long)local_7610) {
                  firstchar = (FITSfile *)0x7530;
                }
                local_7620 = firstchar;
                ffread(fptr_00,(long)piVar5,status_01,status_00);
                ffptbb((fitsfile *)pFVar7,CONCAT17(uVar6,in_stack_ffffffffffff8410),
                       (LONGLONG)firstchar,in_stack_ffffffffffff8400,(uchar *)values,status_04);
                local_7610 = (FITSfile *)((long)local_7610 - (long)local_7620);
                local_7618 = (long)&local_7620->filehandle + local_7618;
              }
              ffrdef(in_stack_ffffffffffff8498,(int *)in_stack_ffffffffffff8490);
              local_34 = *local_60;
            }
            else {
              ffpmsg((char *)0x12e81c);
              local_34 = *local_60;
            }
          }
          else {
            ffpmsg((char *)0x12e63b);
            local_34 = *local_60;
          }
        }
        else {
          ffpmsg((char *)0x12e591);
          ffpmsg((char *)0x12e59d);
          *local_60 = 0xe3;
          local_34 = 0xe3;
        }
      }
      else {
        local_34 = *local_60;
      }
    }
    else {
      ffpmsg((char *)0x12e3a1);
      ffpmsg((char *)0x12e3ae);
      local_34 = *local_60;
    }
  }
  else {
    local_34 = *local_60;
  }
  return local_34;
}

Assistant:

int fits_copy_cell2image(
	   fitsfile *fptr,   /* I - point to input table */
	   fitsfile *newptr, /* O - existing output file; new image HDU
				    will be appended to it */
           char *colname,    /* I - column name / number containing the image*/
           long rownum,      /* I - number of the row containing the image */
           int *status)      /* IO - error status */

/*
  Copy a table cell of a given row and column into an image extension.
  The output file must already have been created.  A new image
  extension will be created in that file.
  
  This routine was written by Craig Markwardt, GSFC
*/

{
    unsigned char buffer[30000];
    int hdutype, colnum, typecode, bitpix, naxis, maxelem, tstatus;
    LONGLONG naxes[9], nbytes, firstbyte, ntodo;
    LONGLONG repeat, startpos, elemnum, rowlen, tnull;
    long twidth, incre;
    double scale, zero;
    char tform[20];
    char card[FLEN_CARD];
    char templt[FLEN_CARD] = "";

    /* Table-to-image keyword translation table  */
    /*                        INPUT      OUTPUT  */
    /*                       01234567   01234567 */
    char *patterns[][2] = {{"TSCALn",  "BSCALE"  },  /* Standard FITS keywords */
			   {"TZEROn",  "BZERO"   },
			   {"TUNITn",  "BUNIT"   },
			   {"TNULLn",  "BLANK"   },
			   {"TDMINn",  "DATAMIN" },
			   {"TDMAXn",  "DATAMAX" },
			   {"iCTYPn",  "CTYPEi"  },  /* Coordinate labels */
			   {"iCTYna",  "CTYPEia" },
			   {"iCUNIn",  "CUNITi"  },  /* Coordinate units */
			   {"iCUNna",  "CUNITia" },
			   {"iCRVLn",  "CRVALi"  },  /* WCS keywords */
			   {"iCRVna",  "CRVALia" },
			   {"iCDLTn",  "CDELTi"  },
			   {"iCDEna",  "CDELTia" },
			   {"iCRPXn",  "CRPIXi"  },
			   {"iCRPna",  "CRPIXia" },
			   {"ijPCna",  "PCi_ja"  },
			   {"ijCDna",  "CDi_ja"  },
			   {"iVn_ma",  "PVi_ma"  },
			   {"iSn_ma",  "PSi_ma"  },
			   {"iCRDna",  "CRDERia" },
			   {"iCSYna",  "CSYERia" },
			   {"iCROTn",  "CROTAi"  },
			   {"WCAXna",  "WCSAXESa"},
			   {"WCSNna",  "WCSNAMEa"},

			   {"LONPna",  "LONPOLEa"},
			   {"LATPna",  "LATPOLEa"},
			   {"EQUIna",  "EQUINOXa"},
			   {"MJDOBn",  "MJD-OBS" },
			   {"MJDAn",   "MJD-AVG" },
			   {"RADEna",  "RADESYSa"},
			   {"iCNAna",  "CNAMEia" },
			   {"DAVGn",   "DATE-AVG"},

                           /* Delete table keywords related to other columns */
			   {"T????#a", "-"       }, 
 			   {"TC??#a",  "-"       },
 			   {"TWCS#a",  "-"       },
			   {"TDIM#",   "-"       }, 
			   {"iCTYPm",  "-"       },
			   {"iCUNIm",  "-"       },
			   {"iCRVLm",  "-"       },
			   {"iCDLTm",  "-"       },
			   {"iCRPXm",  "-"       },
			   {"iCTYma",  "-"       },
			   {"iCUNma",  "-"       },
			   {"iCRVma",  "-"       },
			   {"iCDEma",  "-"       },
			   {"iCRPma",  "-"       },
			   {"ijPCma",  "-"       },
			   {"ijCDma",  "-"       },
			   {"iVm_ma",  "-"       },
			   {"iSm_ma",  "-"       },
			   {"iCRDma",  "-"       },
			   {"iCSYma",  "-"       },
			   {"iCROTm",  "-"       },
			   {"WCAXma",  "-"       },
			   {"WCSNma",  "-"       },

			   {"LONPma",  "-"       },
			   {"LATPma",  "-"       },
			   {"EQUIma",  "-"       },
			   {"MJDOBm",  "-"       },
			   {"MJDAm",   "-"       },
			   {"RADEma",  "-"       },
			   {"iCNAma",  "-"       },
			   {"DAVGm",   "-"       },

			   {"EXTNAME", "-"       },  /* Remove structural keywords*/
			   {"EXTVER",  "-"       },
			   {"EXTLEVEL","-"       },
			   {"CHECKSUM","-"       },
			   {"DATASUM", "-"       },
			   
			   {"*",       "+"       }}; /* copy all other keywords */
    int npat;

    if (*status > 0)
        return(*status);

    /* get column number */
    if (ffgcno(fptr, CASEINSEN, colname, &colnum, status) > 0)
    {
        ffpmsg("column containing image in table cell does not exist:");
        ffpmsg(colname);
        return(*status);
    }

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if ( ffgcprll(fptr, colnum, rownum, 1L, 1L, 0, &scale, &zero,
         tform, &twidth, &typecode, &maxelem, &startpos, &elemnum, &incre,
         &repeat, &rowlen, &hdutype, &tnull, (char *) buffer, status) > 0 )
         return(*status);

     /* get the actual column name, in case a column number was given */
    ffkeyn("", colnum, templt, &tstatus);
    ffgcnn(fptr, CASEINSEN, templt, colname, &colnum, &tstatus);

    if (hdutype != BINARY_TBL)
    {
        ffpmsg("This extension is not a binary table.");
        ffpmsg(" Cannot open the image in a binary table cell.");
        return(*status = NOT_BTABLE);
    }

    if (typecode < 0)
    {
        /* variable length array */
        typecode *= -1;  

        /* variable length arrays are 1-dimensional by default */
        naxis = 1;
        naxes[0] = repeat;
    }
    else
    {
        /* get the dimensions of the image */
        ffgtdmll(fptr, colnum, 9, &naxis, naxes, status);
    }

    if (*status > 0)
    {
        ffpmsg("Error getting the dimensions of the image");
        return(*status);
    }

    /* determine BITPIX value for the image */
    if (typecode == TBYTE)
    {
        bitpix = BYTE_IMG;
        nbytes = repeat;
    }
    else if (typecode == TSHORT)
    {
        bitpix = SHORT_IMG;
        nbytes = repeat * 2;
    }
    else if (typecode == TLONG)
    {
        bitpix = LONG_IMG;
        nbytes = repeat * 4;
    }
    else if (typecode == TFLOAT)
    {
        bitpix = FLOAT_IMG;
        nbytes = repeat * 4;
    }
    else if (typecode == TDOUBLE)
    {
        bitpix = DOUBLE_IMG;
        nbytes = repeat * 8;
    }
    else if (typecode == TLONGLONG)
    {
        bitpix = LONGLONG_IMG;
        nbytes = repeat * 8;
    }
    else if (typecode == TLOGICAL)
    {
        bitpix = BYTE_IMG;
        nbytes = repeat;
    }
    else
    {
        ffpmsg("Error: the following image column has invalid datatype:");
        ffpmsg(colname);
        ffpmsg(tform);
        ffpmsg("Cannot open an image in a single row of this column.");
        return(*status = BAD_TFORM);
    }

    /* create new image in output file */
    if (ffcrimll(newptr, bitpix, naxis, naxes, status) > 0)
    {
        ffpmsg("failed to write required primary array keywords in the output file");
        return(*status);
    }

    npat = sizeof(patterns)/sizeof(patterns[0][0])/2;
    
    /* skip over the first 8 keywords, starting just after TFIELDS */
    fits_translate_keywords(fptr, newptr, 9, patterns, npat,
			    colnum, 0, 0, status);

    /* add some HISTORY  */
    snprintf(card,FLEN_CARD,"HISTORY  This image was copied from row %ld of column '%s',",
            rownum, colname);
/* disable this; leave it up to the caller to write history if needed.    
    ffprec(newptr, card, status);
*/
    /* the use of ffread routine, below, requires that any 'dirty' */
    /* buffers in memory be flushed back to the file first */
    
    ffflsh(fptr, FALSE, status);

    /* finally, copy the data, one buffer size at a time */
    ffmbyt(fptr, startpos, TRUE, status);
    firstbyte = 1; 

    /* the upper limit on the number of bytes must match the declaration */
    /* read up to the first 30000 bytes in the normal way with ffgbyt */

    ntodo = minvalue(30000, nbytes);
    ffgbyt(fptr, ntodo, buffer, status);
    ffptbb(newptr, 1, firstbyte, ntodo, buffer, status);

    nbytes    -= ntodo;
    firstbyte += ntodo;

    /* read any additional bytes with low-level ffread routine, for speed */
    while (nbytes && (*status <= 0) )
    {
        ntodo = minvalue(30000, nbytes);
        ffread((fptr)->Fptr, (long) ntodo, buffer, status);
        ffptbb(newptr, 1, firstbyte, ntodo, buffer, status);
        nbytes    -= ntodo;
        firstbyte += ntodo;
    }

    /* Re-scan the header so that CFITSIO knows about all the new keywords */
    ffrdef(newptr,status);

    return(*status);
}